

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  size_t *psVar1;
  uint64_t *puVar2;
  byte bVar3;
  _7zip *zip;
  uint uVar4;
  Bool BVar5;
  uint32_t uVar6;
  uchar *puVar7;
  uint8_t *__src;
  ssize_t sVar8;
  undefined8 uVar9;
  unsigned_long uVar10;
  void *pvVar11;
  ulong uVar12;
  byte bVar13;
  int iVar14;
  long lVar15;
  size_t sVar16;
  uint64_t uVar17;
  char *pcVar18;
  ulong uVar19;
  size_t sVar20;
  size_t sVar21;
  long lVar22;
  ulong uVar23;
  uint uVar25;
  uchar *puVar26;
  uint uVar27;
  uchar *puVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong outSize;
  uchar *puVar34;
  size_t sVar35;
  bool bVar36;
  bool bVar37;
  ZSTD_inBuffer input;
  ulong local_f8;
  ulong local_d8;
  int local_d0;
  int local_cc;
  lzma_stream *local_c8;
  uchar *local_c0;
  CPpmd7z_RangeDec *local_b8;
  ulong local_b0;
  long local_a8;
  uchar *local_a0;
  code *local_98;
  IByteIn *local_90;
  z_stream *local_88;
  size_t local_80;
  size_t local_78;
  CPpmd7 *local_70;
  code *local_68;
  uchar *local_60;
  ulong local_58;
  long local_50;
  uint8_t *local_48;
  ulong local_40;
  long local_38;
  uchar *puVar24;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar11 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_d8);
    if (0 < (long)local_d8 && pvVar11 != (void *)0x0) {
      uVar32 = zip->folder_outbytes_remaining;
      uVar19 = zip->pack_stream_inbytes_remaining;
      if (uVar19 <= local_d8) {
        local_d8 = uVar19;
      }
      zip->pack_stream_inbytes_remaining = uVar19 - local_d8;
      if (uVar32 <= local_d8) {
        local_d8 = uVar32;
      }
      zip->folder_outbytes_remaining = uVar32 - local_d8;
      zip->uncompressed_buffer_bytes_remaining = local_d8;
      return 0;
    }
  }
  else {
    puVar34 = zip->uncompressed_buffer;
    local_80 = minimum;
    if (puVar34 == (uchar *)0x0) {
      sVar16 = 0x10000;
      if (0x10000 < minimum) {
        sVar16 = minimum + 0x3ff & 0xfffffffffffffc00;
      }
      zip->uncompressed_buffer_size = sVar16;
      puVar34 = (uchar *)malloc(sVar16);
      zip->uncompressed_buffer = puVar34;
      if (puVar34 == (uchar *)0x0) {
LAB_0016d3c4:
        pcVar18 = "No memory for 7-Zip decompression";
        iVar14 = 0xc;
        goto LAB_0016e2fd;
      }
LAB_0016d409:
      zip->uncompressed_buffer_bytes_remaining = 0;
    }
    else if (zip->uncompressed_buffer_size < minimum) {
      puVar24 = zip->uncompressed_buffer_pointer;
      uVar32 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar7 = (uchar *)realloc(puVar34,uVar32);
      if (puVar7 == (uchar *)0x0) goto LAB_0016d3c4;
      lVar22 = (long)puVar24 - (long)puVar34;
      if (puVar24 == (uchar *)0x0) {
        lVar22 = 0;
      }
      zip->uncompressed_buffer = puVar7;
      zip->uncompressed_buffer_size = uVar32;
      puVar34 = puVar7;
LAB_0016d3f0:
      if (lVar22 != 0) {
        memmove(puVar34,puVar34 + lVar22,zip->uncompressed_buffer_bytes_remaining);
      }
    }
    else {
      if (minimum <= zip->uncompressed_buffer_bytes_remaining) goto LAB_0016d409;
      if (zip->uncompressed_buffer_pointer != (uchar *)0x0) {
        lVar22 = (long)zip->uncompressed_buffer_pointer - (long)puVar34;
        goto LAB_0016d3f0;
      }
    }
    zip->uncompressed_buffer_pointer = (uchar *)0x0;
    __src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_d8);
    if (0 < (long)local_d8) {
      local_a0 = zip->odd_bcj;
      local_90 = &zip->bytein;
      local_b8 = &zip->range_dec;
      local_98 = Ppmd7z_RangeDec_Init;
      local_68 = Ppmd7_DecodeSymbol;
      local_70 = &zip->ppmd7_context;
      local_88 = &zip->stream;
      local_c8 = &zip->lzstream;
      do {
        puVar24 = zip->uncompressed_buffer;
        sVar21 = zip->uncompressed_buffer_size;
        sVar35 = zip->uncompressed_buffer_bytes_remaining;
        puVar34 = puVar24 + sVar35;
        uVar33 = sVar21 - sVar35;
        uVar32 = zip->pack_stream_inbytes_remaining;
        uVar19 = local_d8;
        if (uVar32 <= local_d8) {
          uVar19 = uVar32;
        }
        uVar10 = zip->codec2;
        outSize = uVar33;
        puVar7 = puVar34;
        if (uVar10 != 0x3030103 || zip->codec == 0x21) {
LAB_0016d5b7:
          sVar21 = outSize;
          puVar26 = puVar7;
          local_c0 = puVar34;
          if (uVar10 == 0x303011b) {
            sVar21 = zip->tmp_stream_bytes_remaining;
            if (sVar21 == 0) {
LAB_0016d638:
              sVar21 = zip->tmp_stream_buff_size;
              puVar26 = zip->tmp_stream_buff;
              goto LAB_0016d653;
            }
            sVar8 = Bcj2_Decode(zip,puVar7,outSize);
            if (-1 < sVar8) {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar21);
              outSize = outSize - sVar8;
              if ((uVar32 == 0) || (outSize == 0)) {
                uVar31 = uVar33 - outSize;
                if (uVar32 == 0) {
                  uVar4 = (uint)(zip->tmp_stream_bytes_remaining != 0);
                }
                else {
                  uVar4 = 0;
                }
                goto LAB_0016db8a;
              }
              puVar7 = puVar7 + sVar8;
              goto LAB_0016d638;
            }
LAB_0016e2e4:
            pcVar18 = "BCJ2 conversion Failed";
          }
          else {
LAB_0016d653:
            uVar10 = zip->codec;
            if ((long)uVar10 < 0x30401) {
              if (uVar10 == 0) {
                uVar31 = sVar21;
                if (uVar19 < sVar21) {
                  uVar31 = uVar19;
                }
                memcpy(puVar26,__src,uVar31);
                sVar20 = uVar19 - uVar31;
                sVar21 = sVar21 - uVar31;
                uVar12 = (ulong)(uVar32 == 0);
              }
              else {
                if ((uVar10 != 0x21) && (uVar10 != 0x30101)) goto LAB_0016e2ed;
                (zip->lzstream).next_in = __src;
                (zip->lzstream).avail_in = uVar19;
                (zip->lzstream).next_out = puVar26;
                (zip->lzstream).avail_out = sVar21;
                uVar4 = lzma_code(local_c8,0);
                if (uVar4 != 0) {
                  if (uVar4 != 1) {
                    pcVar18 = "Decompression failed(%d)";
                    goto LAB_0016e351;
                  }
                  lzma_end(local_c8);
                  zip->lzstream_valid = 0;
                }
                sVar20 = (zip->lzstream).avail_in;
                sVar21 = (zip->lzstream).avail_out;
                uVar12 = (ulong)uVar4;
              }
LAB_0016d8e7:
              uVar31 = uVar33 - sVar21;
              uVar4 = (uint)uVar12;
              local_78 = sVar21;
              if (zip->codec == 0x21) {
LAB_0016e0ab:
                uVar10 = zip->codec2;
              }
              else {
                uVar10 = zip->codec2;
                if (0x3030204 < (long)uVar10) {
                  if (uVar10 == 0x3030205) {
                    if ((uVar31 & 0xfffffffffffffffc) == 0) {
                      uVar32 = 0;
                    }
                    else {
                      iVar14 = 0;
                      uVar32 = 0;
                      do {
                        if ((puVar24[uVar32 + sVar35] & 0xfc) == 0x48) {
                          bVar13 = puVar24[uVar32 + sVar35 + 3];
                          if ((bVar13 & 3) == 1) {
                            uVar6 = zip->bcj_ip;
                            iVar29 = ((bVar13 & 0xfffffffc |
                                      (uint)puVar24[uVar32 + sVar35 + 2] << 8 |
                                      (uint)puVar24[uVar32 + sVar35 + 1] << 0x10 |
                                      (puVar24[uVar32 + sVar35] & 3) << 0x18) - uVar6) + iVar14;
                            puVar24[uVar32 + sVar35] = (byte)((uint)iVar29 >> 0x18) & 3 | 0x48;
                            puVar24[uVar32 + sVar35 + 1] = (uchar)((uint)iVar29 >> 0x10);
                            puVar24[uVar32 + sVar35 + 2] = (uchar)((uint)iVar29 >> 8);
                            puVar24[uVar32 + sVar35 + 3] =
                                 ((bVar13 & 0xfc) - (char)uVar6) + (char)iVar14 | bVar13 & 3;
                          }
                        }
                        uVar32 = uVar32 + 4;
                        iVar14 = iVar14 + -4;
                      } while (uVar32 < (uVar31 & 0xfffffffffffffffc));
                    }
                    zip->bcj_ip = zip->bcj_ip + (int)uVar32;
                    uVar31 = uVar32;
                  }
                  else if (uVar10 == 0x3030501) {
                    if (uVar31 < 4) {
                      uVar31 = 0;
                    }
                    else {
                      uVar32 = 4;
                      lVar22 = 0;
                      do {
                        if (local_c0[uVar32 - 1] == 0xeb) {
                          uVar27 = ((((uint)local_c0[uVar32 - 3] << 10 |
                                     (uint)local_c0[uVar32 - 2] << 0x12) +
                                    (uint)local_c0[uVar32 - 4] * 4) - zip->bcj_ip) + (int)lVar22;
                          local_c0[uVar32 - 4] = (uchar)(uVar27 >> 2);
                          local_c0[uVar32 - 3] = (uchar)(uVar27 >> 10);
                          local_c0[uVar32 - 2] = (uchar)(uVar27 >> 0x12);
                        }
                        uVar32 = uVar32 + 4;
                        lVar22 = lVar22 + -4;
                      } while (uVar32 <= uVar31);
                      uVar31 = -lVar22;
                    }
                    zip->bcj_ip = zip->bcj_ip + (int)uVar31;
                  }
                  else {
                    if (uVar10 != 0x3030805) goto LAB_0016e0b2;
                    if ((uVar31 & 0xfffffffffffffffc) == 0) {
                      uVar32 = 0;
                    }
                    else {
                      iVar14 = 0;
                      uVar32 = 0;
                      do {
                        uVar27 = (uint)puVar24[uVar32 + sVar35 + 1] * 0x10000 +
                                 (uint)puVar24[uVar32 + sVar35] * 0x1000000 >> 0x16;
                        if ((uVar27 == 0x1ff) || (uVar27 == 0x100)) {
                          uVar27 = (((uint)puVar24[uVar32 + sVar35] * 0x1000000 +
                                     (uint)puVar24[uVar32 + sVar35 + 1] * 0x10000 +
                                    (uint)puVar24[uVar32 + sVar35 + 3] +
                                    (uint)puVar24[uVar32 + sVar35 + 2] * 0x100) * 4 - zip->bcj_ip) +
                                   iVar14;
                          uVar25 = uVar27 >> 2;
                          iVar29 = 0x40000000 - (uVar25 & 0x400000);
                          puVar24[uVar32 + sVar35] = (byte)((uint)iVar29 >> 0x18) | 0x40;
                          puVar24[uVar32 + sVar35 + 1] =
                               (byte)(uVar25 >> 0x10) & 0x3f | (byte)((uint)iVar29 >> 0x10);
                          puVar24[uVar32 + sVar35 + 2] = (uchar)(uVar27 >> 10);
                          puVar24[uVar32 + sVar35 + 3] = (uchar)uVar25;
                        }
                        uVar32 = uVar32 + 4;
                        iVar14 = iVar14 + -4;
                      } while (uVar32 < (uVar31 & 0xfffffffffffffffc));
                    }
                    zip->bcj_ip = zip->bcj_ip + (int)uVar32;
                    uVar31 = uVar32;
                  }
                  goto LAB_0016e0ab;
                }
                if (uVar10 == 10) {
                  if (uVar31 < 4) {
                    uVar23 = 0;
                  }
                  else {
                    uVar32 = 0;
                    do {
                      bVar13 = puVar24[uVar32 + sVar35];
                      uVar27 = (uint)puVar24[uVar32 + sVar35 + 2] << 0x10 |
                               (uint)puVar24[uVar32 + sVar35 + 1] << 8;
                      uVar25 = uVar27 | bVar13;
                      bVar3 = puVar24[uVar32 + sVar35 + 3];
                      if ((bVar3 & 0xfc) == 0x94) {
                        iVar14 = (uVar25 | (uint)bVar3 << 0x18) - (zip->bcj_ip + (int)uVar32 >> 2);
                        puVar24[uVar32 + sVar35] = (uchar)iVar14;
                        puVar24[uVar32 + sVar35 + 1] = (uchar)((uint)iVar14 >> 8);
                        puVar24[uVar32 + sVar35 + 2] = (uchar)((uint)iVar14 >> 0x10);
                        bVar13 = (byte)((uint)iVar14 >> 0x18) & 3 | 0x94;
LAB_0016dd24:
                        puVar24[uVar32 + sVar35 + 3] = bVar13;
                      }
                      else if (((bVar3 & 0x9f) == 0x90) &&
                              (((uVar25 >> 3) + 0x20000 & 0x1c0000) == 0)) {
                        uVar25 = (bVar3 >> 5 & 3 | (uVar27 | bVar13 & 0xffffffe0) >> 3) -
                                 (zip->bcj_ip + (int)uVar32 >> 0xc);
                        uVar27 = uVar25 * 8 & 0x1fffe0;
                        puVar24[uVar32 + sVar35] = bVar13 & 0x1f | (byte)uVar27;
                        puVar24[uVar32 + sVar35 + 1] = (uchar)(uVar25 >> 5);
                        puVar24[uVar32 + sVar35 + 2] =
                             (byte)(-(uVar25 & 0x20000) >> 0x10) & 0xe0 | (byte)(uVar27 >> 0x10);
                        bVar13 = (char)uVar25 << 5 | 0x90;
                        goto LAB_0016dd24;
                      }
                      uVar23 = uVar32 + 4;
                      uVar12 = uVar32 + 8;
                      uVar32 = uVar23;
                    } while (uVar12 <= uVar31);
                  }
                  zip->bcj_ip = zip->bcj_ip + (int)uVar23;
                  uVar31 = uVar23;
                  goto LAB_0016e0ab;
                }
                if (uVar10 == 0x3030103) {
                  if (uVar31 < 5) {
                    uVar23 = 0;
                  }
                  else {
                    puVar34 = (uchar *)zip->bcj_prevPosT;
                    uVar6 = zip->bcj_prevMask;
                    puVar26 = local_c0 + (uVar31 - 4);
                    puVar24 = local_c0;
                    if (local_c0 < puVar26) {
                      local_a8 = -(long)local_c0;
                      uVar27 = (uint)local_c0;
                      local_cc = uVar27 - zip->bcj_ip;
                      local_d0 = (uVar27 - zip->bcj_ip) + -1;
                      local_b0 = (ulong)~uVar27;
                      do {
                        puVar28 = puVar24;
                        lVar22 = 0;
                        while ((puVar28[lVar22] & 0xfe) != 0xe8) {
                          lVar15 = lVar22 + 1;
                          lVar22 = lVar22 + 1;
                          if (puVar26 <= puVar28 + lVar15) {
                            puVar24 = puVar28 + lVar22;
                            goto LAB_0016e032;
                          }
                        }
                        local_f8 = 0;
                        if (puVar28 + lVar22 + (local_a8 - (long)puVar34) < (uchar *)0x4) {
                          uVar6 = uVar6 << ((char)lVar22 +
                                            (((char)~uVar27 + (char)puVar28) - (char)puVar34) &
                                           0x1fU) & 7;
                          if ((uVar6 == 0) ||
                             (((0xe8U >> uVar6 & 1) == 0 &&
                              (local_f8 = (ulong)uVar6,
                              (byte)(puVar28[lVar22 + (4 - (ulong)*(byte *)((long)&
                                                  x86_Convert_kMaskToBitNumber + (ulong)uVar6))] - 1
                                    ) < 0xfe)))) goto LAB_0016deb4;
LAB_0016df99:
                          uVar6 = (uVar6 & 3) * 2 + 1;
                          lVar15 = 1;
                        }
                        else {
LAB_0016deb4:
                          bVar13 = puVar28[lVar22 + 4];
                          uVar6 = (uint32_t)local_f8;
                          if ((bVar13 != 0xff) && (bVar13 != 0)) goto LAB_0016df99;
                          uVar23 = ((ulong)(uint)(local_cc - (int)puVar28) +
                                   (ulong)((uint)puVar28[lVar22 + 1] |
                                          (uint)puVar28[lVar22 + 2] << 8 |
                                          (uint)puVar28[lVar22 + 3] << 0x10 | (uint)bVar13 << 0x18))
                                   - lVar22;
                          uVar25 = (uint)uVar23;
                          if (uVar6 != 0) {
                            while( true ) {
                              uVar25 = (uint)uVar23;
                              uVar30 = uVar25 >> (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                           local_f8) * -8 + 0x18U & 0x1f);
                              if (((char)uVar30 != -1) && ((uVar30 & 0xff) != 0)) break;
                              uVar23 = (ulong)(((local_d0 - (int)puVar28) - (int)lVar22) -
                                              (uVar25 ^ -1 << (*(char *)((long)&
                                                  x86_Convert_kMaskToBitNumber + local_f8) * -8 &
                                                  0x1fU)));
                            }
                          }
                          puVar28[lVar22 + 4] = (uchar)((int)(uVar25 << 7) >> 0x1f);
                          puVar28[lVar22 + 3] = (uchar)(uVar25 >> 0x10);
                          puVar28[lVar22 + 2] = (uchar)(uVar25 >> 8);
                          puVar28[lVar22 + 1] = (uchar)uVar25;
                          lVar15 = 5;
                        }
                        puVar34 = puVar28 + lVar22 + local_a8;
                        puVar24 = puVar28 + lVar15 + lVar22;
                      } while (puVar28 + lVar15 + lVar22 < puVar26);
                      puVar34 = puVar28 + (lVar22 - (long)local_c0);
                      puVar24 = puVar28 + lVar22 + lVar15;
                    }
LAB_0016e032:
                    uVar23 = (long)puVar24 - (long)local_c0;
                    zip->bcj_prevPosT = (size_t)puVar34;
                    zip->bcj_prevMask = uVar6;
                    zip->bcj_ip = zip->bcj_ip + (int)uVar23;
                  }
                  sVar16 = uVar31 - uVar23;
                  zip->odd_bcj_size = sVar16;
                  if ((((sVar16 == 0) || (uVar4 == 1)) || (4 < sVar16)) || (uVar32 == 0)) {
                    zip->odd_bcj_size = 0;
                  }
                  else {
                    memcpy(local_a0,local_c0 + uVar23,sVar16);
                    uVar31 = uVar23;
                  }
                  goto LAB_0016e0ab;
                }
              }
LAB_0016e0b2:
              if (uVar10 == 0x303011b) {
                uVar32 = zip->tmp_stream_buff_size - local_78;
                if (zip->main_stream_bytes_remaining <= uVar32) {
                  uVar32 = zip->main_stream_bytes_remaining;
                }
                zip->tmp_stream_bytes_avail = uVar32;
                zip->tmp_stream_bytes_remaining = uVar32;
                sVar8 = Bcj2_Decode(zip,puVar7,outSize);
                if (sVar8 < 0) goto LAB_0016e2e4;
                zip->main_stream_bytes_remaining =
                     zip->main_stream_bytes_remaining +
                     (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
                uVar31 = (uVar33 - outSize) + sVar8;
              }
              if (1 < uVar4) {
                return -0x1e;
              }
              sVar20 = uVar19 - sVar20;
              goto LAB_0016e141;
            }
            if (uVar10 != 0x30401) {
              if (uVar10 == 0x40108) {
                (zip->stream).next_in = __src;
                (zip->stream).avail_in = (uInt)uVar19;
                (zip->stream).next_out = puVar26;
                (zip->stream).avail_out = (uInt)sVar21;
                uVar4 = inflate(local_88,0);
                if (1 < uVar4) {
                  pcVar18 = "File decompression failed (%d)";
LAB_0016e351:
                  archive_set_error(&a->archive,-1,pcVar18);
                  return -0x1e;
                }
                sVar20 = (size_t)(zip->stream).avail_in;
                sVar21 = (size_t)(zip->stream).avail_out;
                uVar12 = (ulong)uVar4;
              }
              else {
                if (uVar10 != 0x4f71101) goto LAB_0016e2ed;
                local_38 = 0;
                local_50 = 0;
                local_60 = puVar26;
                local_58 = sVar21;
                local_48 = __src;
                local_40 = uVar19;
                uVar9 = ZSTD_decompressStream(zip->zstd_dstream,&local_60,&local_48);
                iVar14 = ZSTD_isError(uVar9);
                if (iVar14 != 0) {
                  uVar9 = ZSTD_getErrorName(uVar9);
                  archive_set_error(&a->archive,-1,"Zstd decompression failed: %s",uVar9);
                  return -0x1e;
                }
                sVar20 = uVar19 - local_38;
                sVar21 = sVar21 - local_50;
                uVar12 = 0;
              }
              goto LAB_0016d8e7;
            }
            if (((zip->ppmd7_valid != 0) && (iVar14 = zip->ppmd7_stat, -1 < iVar14)) &&
               (sVar21 != 0)) {
              (zip->ppstream).next_in = __src;
              (zip->ppstream).avail_in = uVar19;
              (zip->ppstream).stream_in = 0;
              (zip->ppstream).next_out = puVar26;
              (zip->ppstream).avail_out = sVar21;
              if (iVar14 == 0) {
                (zip->bytein).a = a;
                (zip->bytein).Read = ppmd_read;
                (zip->range_dec).Stream = local_90;
                BVar5 = (*local_98)(local_b8);
                if (BVar5 == 0) {
                  zip->ppmd7_stat = -1;
                  pcVar18 = "Failed to initialize PPMd range decoder";
                  goto LAB_0016e2f8;
                }
                if ((zip->ppstream).overconsumed != 0) {
LAB_0016e2bc:
                  zip->ppmd7_stat = -1;
                  return -0x1e;
                }
                zip->ppmd7_stat = 1;
              }
              if (uVar32 == 0) {
                uVar31 = zip->folder_outbytes_remaining;
              }
              else {
                uVar31 = 0;
              }
              do {
                uVar23 = uVar31;
                iVar14 = (*local_68)(local_70,&local_b8->p);
                if (iVar14 < 0) {
                  zip->ppmd7_stat = -1;
                  pcVar18 = "Failed to decode PPMd";
                  goto LAB_0016e24e;
                }
                if ((zip->ppstream).overconsumed != 0) goto LAB_0016e2bc;
                puVar34 = (zip->ppstream).next_out;
                (zip->ppstream).next_out = puVar34 + 1;
                *puVar34 = (uchar)iVar14;
                sVar21 = (zip->ppstream).avail_out - 1;
                (zip->ppstream).avail_out = sVar21;
                (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
                sVar20 = (zip->ppstream).avail_in;
                uVar12 = 0;
                if (sVar21 == 0) {
                  sVar21 = 0;
                  uVar12 = 0;
                  break;
                }
                uVar31 = uVar23 - 1;
                if (uVar23 == 0) {
                  uVar31 = uVar12;
                }
              } while ((sVar20 != 0) || (sVar20 = 0, 1 < uVar23));
              goto LAB_0016d8e7;
            }
LAB_0016e2ed:
            pcVar18 = "Decompression internal error";
          }
LAB_0016e2f8:
          iVar14 = -1;
          goto LAB_0016e2fd;
        }
        if (uVar33 < 5 && uVar32 != 0) {
          if (zip->odd_bcj_size == 0) goto LAB_0016d59e;
          uVar17 = zip->folder_outbytes_remaining;
          bVar37 = false;
          sVar20 = 0;
          bVar36 = false;
          uVar31 = 0;
        }
        else {
          if (uVar33 != 0 && zip->odd_bcj_size != 0) {
            lVar22 = 0;
            do {
              puVar34[lVar22] = zip->odd_bcj[lVar22];
              lVar15 = lVar22 + 1;
              psVar1 = &zip->odd_bcj_size;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) break;
              bVar37 = uVar33 - 1 != lVar22;
              lVar22 = lVar15;
            } while (bVar37);
            puVar7 = puVar34 + lVar15;
            outSize = uVar33 - lVar15;
          }
LAB_0016d59e:
          if ((uVar32 != 0) && (outSize != 0)) {
            uVar10 = zip->codec2;
            goto LAB_0016d5b7;
          }
          uVar4 = (uint)(uVar32 == 0);
          uVar31 = uVar33 - outSize;
LAB_0016db8a:
          sVar20 = 0;
LAB_0016e141:
          uVar17 = zip->folder_outbytes_remaining;
          if (uVar17 <= uVar31) {
            uVar31 = uVar17;
          }
          bVar36 = uVar4 != 0;
          puVar2 = &zip->pack_stream_inbytes_remaining;
          *puVar2 = *puVar2 - sVar20;
          bVar37 = *puVar2 == 0;
          sVar21 = zip->uncompressed_buffer_size;
          sVar35 = zip->uncompressed_buffer_bytes_remaining;
        }
        zip->folder_outbytes_remaining = uVar17 - uVar31;
        uVar32 = sVar35 + uVar31;
        zip->uncompressed_buffer_bytes_remaining = uVar32;
        zip->pack_stream_bytes_unconsumed = sVar20;
        if (((uVar32 == sVar21) ||
            ((zip->codec2 == 0x3030103 && (sVar21 < uVar32 + 5 && zip->odd_bcj_size != 0)))) ||
           ((bool)(bVar37 & uVar17 == uVar31))) {
          if (local_80 <= uVar32) {
            zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
            return 0;
          }
LAB_0016e262:
          pcVar18 = "Damaged 7-Zip archive";
          goto LAB_0016e2f8;
        }
        if ((bool)(bVar36 | (uVar31 == 0 && sVar20 == 0))) goto LAB_0016e262;
        read_consume(a);
        __src = (uint8_t *)__archive_read_ahead(a,1,(ssize_t *)&local_d8);
      } while (0 < (long)local_d8);
    }
  }
  pcVar18 = "Truncated 7-Zip file body";
LAB_0016e24e:
  iVar14 = 0x54;
LAB_0016e2fd:
  archive_set_error(&a->archive,iVar14,pcVar18);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if ((uint64_t)bytes_avail > zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if ((uint64_t)bytes_avail > zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}